

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

int __thiscall GrcSymbolTableEntry::UserDefinableSlotAttrIndex(GrcSymbolTableEntry *this)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  
  uVar1 = (this->m_staFieldName)._M_string_length;
  uVar2 = 4;
  iVar3 = 0;
  do {
    iVar4 = iVar3;
    uVar6 = uVar2;
    if (uVar1 <= uVar6) break;
    bVar5 = (this->m_staFieldName)._M_dataplus._M_p[uVar6] - 0x30;
    uVar2 = uVar6 + 1;
    iVar3 = iVar4 * 10 + (int)(char)bVar5;
  } while (bVar5 < 10);
  iVar3 = -1;
  if (uVar1 <= uVar6) {
    iVar3 = iVar4 + -1;
  }
  return iVar3;
}

Assistant:

int GrcSymbolTableEntry::UserDefinableSlotAttrIndex()
{
	Assert(IsUserDefinableSlotAttr());
	int nRet = 0;
	for (size_t ich = 4; ich < m_staFieldName.length(); ich++)
	{
		char ch = m_staFieldName[ich];
		if (ch < '0')
			return -1;
		if (ch > '9')
			return -1;
		nRet = (nRet * 10) + (ch - '0');
	}
	return nRet - 1;	// 0-based
}